

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

void __thiscall CorUnix::CThreadSuspensionInfo::WaitOnResumeSemaphore(CThreadSuspensionInfo *this)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  CThreadSuspensionInfo *this_local;
  
  while( true ) {
    iVar2 = sem_wait((sem_t *)&this->m_semResume);
    if (iVar2 != -1) break;
    fprintf(_stderr,"] %s %s:%d","WaitOnResumeSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
            ,0x2d5);
    __stream = _stderr;
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(__stream,"sem_wait returned -1 and set errno to %d (%s)\n",(ulong)uVar1,pcVar5);
  }
  return;
}

Assistant:

void
CThreadSuspensionInfo::WaitOnResumeSemaphore()
{
#if USE_POSIX_SEMAPHORES
    while (sem_wait(&m_semResume) == -1)
    {
        ASSERT("sem_wait returned -1 and set errno to %d (%s)\n", errno, strerror(errno));
    }
#elif USE_SYSV_SEMAPHORES
    while (semop(m_nSemrespid, &m_sbSemwait, 1) == -1)
    {
        ASSERT("semop wait returned -1 and set errno to %d (%s)\n", errno, strerror(errno));
    }
#elif USE_PTHREAD_CONDVARS
    int status;

    // By the time we wait the target thread may have already signalled its resumption (in
    // which case m_fResumed will be TRUE and we shouldn't wait on the cond var). But we
    // must check the flag and potentially wait atomically to avoid the race where we read
    // the flag and the target thread sets it and signals before we have a chance to wait.

    status = pthread_mutex_lock(&m_mutexResume);
    if (status != 0)
    {
        ASSERT("pthread_mutex_lock returned %d (%s)\n", status, strerror(status));
    }

    // If the target has already acknowledged the resume we shouldn't wait.
    while (!m_fResumed)
    {
        // We got here before the target could signal. Wait on them (which atomically releases
        // the mutex during the wait).
        status = pthread_cond_wait(&m_condResume, &m_mutexResume);
        if (status != 0)
        {
            ASSERT("pthread_cond_wait returned %d (%s)\n", status, strerror(status));
        }
    }

    status = pthread_mutex_unlock(&m_mutexResume);
    if (status != 0)
    {
        ASSERT("pthread_mutex_unlock returned %d (%s)\n", status, strerror(status));
    }
#endif // USE_POSIX_SEMAPHORES
}